

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O2

aiReturn __thiscall Assimp::Exporter::RegisterExporter(Exporter *this,ExportFormatEntry *desc)

{
  ExporterPimpl *pEVar1;
  pointer pEVar2;
  char *__s2;
  int iVar3;
  pointer pEVar4;
  
  pEVar1 = this->pimpl;
  pEVar4 = (pEVar1->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (pEVar1->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __s2 = (desc->mDescription).id;
  do {
    if (pEVar4 == pEVar2) {
      std::
      vector<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ::push_back(&pEVar1->mExporters,desc);
      return aiReturn_SUCCESS;
    }
    iVar3 = strcmp((pEVar4->mDescription).id,__s2);
    pEVar4 = pEVar4 + 1;
  } while (iVar3 != 0);
  return aiReturn_FAILURE;
}

Assistant:

aiReturn Exporter::RegisterExporter(const ExportFormatEntry& desc) {
    for(const ExportFormatEntry& e : pimpl->mExporters) {
        if (!strcmp(e.mDescription.id,desc.mDescription.id)) {
            return aiReturn_FAILURE;
        }
    }

    pimpl->mExporters.push_back(desc);
    return aiReturn_SUCCESS;
}